

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void higan::Logger::SetLogToConsole(void)

{
  bool bVar1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&g_log_file);
  if (bVar1) {
    std::__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>::reset
              (&g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void Logger::SetLogToConsole()
{
	if (g_log_file)
	{
		g_log_file.reset();
	}
}